

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_ManReadExpression(Prs_Man_t *p,int OutItem)

{
  Vec_Int_t *p_00;
  byte bVar1;
  Prs_Ntk_t *pPVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char extraout_DL;
  char extraout_DL_00;
  char Close;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  uint extraout_EDX_09;
  uint uVar9;
  int extraout_EDX_10;
  uint extraout_EDX_11;
  uint extraout_EDX_12;
  int iVar11;
  uint uVar12;
  char cVar13;
  bool bVar14;
  ulong uVar10;
  
  p_00 = &p->vTemp;
  (p->vTemp).nSize = 0;
  Vec_IntPush(p_00,0);
  Vec_IntPush(p_00,OutItem);
  iVar4 = Prs_ManUtilSkipSpaces(p);
  iVar5 = extraout_EDX;
  if (iVar4 == 0) {
    bVar14 = true;
    if (*p->pCur == '(') {
      cVar13 = '>';
      iVar5 = Prs_ManUtilDetectTwo(p,'>','>');
      if (iVar5 == 0) {
        bVar14 = true;
        Close = extraout_DL;
      }
      else {
        cVar13 = '<';
        iVar5 = Prs_ManUtilDetectTwo(p,'<','<');
        bVar14 = iVar5 == 0;
        Close = extraout_DL_00;
      }
      pcVar8 = Prs_ManFindClosingParenthesis(p,cVar13,Close);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = "Expecting closing parenthesis 1.";
        iVar5 = extraout_EDX_00;
        goto LAB_0035ee58;
      }
      *pcVar8 = ' ';
      *p->pCur = ' ';
    }
    iVar4 = Prs_ManUtilSkipSpaces(p);
    iVar5 = extraout_EDX_01;
    if (iVar4 == 0) {
      bVar1 = *p->pCur;
      cVar13 = 9 < (byte)(bVar1 - 0x30);
      uVar12 = 8;
      if (bVar1 == 0x7b || !(bool)cVar13) {
        iVar5 = Prs_ManReadSignal(p);
LAB_0035ee9c:
        Vec_IntPush(p_00,0);
        Vec_IntPush(p_00,iVar5);
      }
      else {
        uVar9 = (uint)bVar1;
        if (bVar1 == 0x21) {
LAB_0035f064:
          uVar12 = uVar9;
          p->pCur = p->pCur + 1;
          iVar4 = Prs_ManUtilSkipSpaces(p);
          iVar5 = extraout_EDX_05;
          if (iVar4 == 0) {
            if (*p->pCur == '(') {
              pcVar8 = Prs_ManFindClosingParenthesis(p,cVar13,(char)extraout_EDX_05);
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "Expecting closing parenthesis 2.";
                iVar5 = extraout_EDX_06;
                goto LAB_0035ee58;
              }
              *pcVar8 = ' ';
              *p->pCur = ' ';
            }
            iVar4 = Prs_ManUtilSkipSpaces(p);
            iVar5 = extraout_EDX_07;
            if (iVar4 == 0) {
              iVar5 = Prs_ManReadSignal(p);
              if (iVar5 == 0) {
                pcVar8 = "Cannot read name after a unary operator.";
                iVar5 = extraout_EDX_08;
                goto LAB_0035ee58;
              }
              goto LAB_0035ee9c;
            }
          }
          goto LAB_0035ee51;
        }
        if (uVar9 == 0x26) {
          uVar9 = 0x1b;
          goto LAB_0035f064;
        }
        if (bVar1 == 0x7e) {
          uVar9 = 9;
          goto LAB_0035f064;
        }
        if (bVar1 == 0x40) {
          uVar9 = 0x38;
          goto LAB_0035f064;
        }
        if (bVar1 == 0x5e) {
          uVar9 = 0x1f;
          goto LAB_0035f064;
        }
        if (bVar1 == 0x7c) {
          uVar9 = 0x1d;
          goto LAB_0035f064;
        }
        if (uVar9 == 0x2d) {
          uVar9 = 0x37;
          goto LAB_0035f064;
        }
        iVar5 = Prs_ManReadSignal(p);
        if (iVar5 == 0) {
          pcVar8 = "Cannot read name after a binary operator.";
          iVar5 = extraout_EDX_03;
          goto LAB_0035ee58;
        }
        iVar4 = Abc_Lit2Var2(iVar5);
        if (iVar4 == p->FuncNameId) {
          iVar4 = Prs_ManUtilSkipSpaces(p);
          iVar5 = extraout_EDX_04;
          if ((iVar4 == 0) && (*p->pCur == '(')) {
            p->pCur = p->pCur + 1;
            iVar11 = 1;
            iVar6 = Prs_ManReadSignalList(p,p_00,')',1);
            uVar12 = (p->vTemp).nSize;
            iVar4 = p->FuncRangeId;
            iVar5 = (int)uVar12 / 2;
            if (iVar4 != 0) {
              pPVar2 = p->pNtk;
              iVar7 = Hash_IntObjData0(pPVar2->vHash,iVar4);
              iVar4 = Hash_IntObjData1(pPVar2->vHash,iVar4);
              iVar7 = iVar7 - iVar4;
              iVar11 = -iVar7;
              if (0 < iVar7) {
                iVar11 = iVar7;
              }
              iVar11 = iVar11 + 1;
            }
            iVar4 = 0x29;
            p->FuncNameId = 0;
            p->FuncRangeId = 0;
            if (iVar6 == 0) {
              return 0;
            }
            if ((uVar12 & 0xfffffffe) == 2) {
              iVar4 = 0x2d;
            }
            else if (iVar5 != iVar11 + 1) {
              if (iVar5 != (1 << ((byte)iVar11 & 0x1f)) + 1) {
                pcVar8 = "Cannot determine word-level operator.";
                goto LAB_0035ee58;
              }
              iVar4 = 0x28;
            }
            p->pCur = p->pCur + 1;
            iVar11 = Prs_ManUtilSkipSpaces(p);
            iVar5 = extraout_EDX_10;
            if (iVar11 == 0) {
              Vec_IntInsert(p_00,0,0);
              Vec_IntInsert(p_00,1,OutItem);
              Prs_NtkAddBox(p->pNtk,iVar4,0,p_00);
              return 1;
            }
          }
          goto LAB_0035ee51;
        }
        Vec_IntPush(p_00,0);
        Vec_IntPush(p_00,iVar5);
        iVar5 = Prs_ManUtilSkipSpaces(p);
        uVar9 = extraout_EDX_09;
        if (iVar5 != 0) {
LAB_0035f103:
          pcVar8 = "Error number 24.";
          goto LAB_0035f10a;
        }
        pbVar3 = (byte *)p->pCur;
        bVar1 = *pbVar3;
        uVar9 = bVar1 - 0x21;
        uVar10 = (ulong)uVar9;
        if (0x1e < uVar9) {
          if (bVar1 == 0x5e) {
            if (pbVar3[1] == 0x5e) goto switchD_0035f134_caseD_1;
            p->pCur = (char *)(pbVar3 + 1);
            uVar12 = 0xe;
          }
          else {
            if (bVar1 != 0x7c) {
              if (bVar1 == 0x5b) {
                __assert_fail("!Prs_ManIsChar(p, \'[\')",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                              ,0x3cd,"int Prs_ManReadExpression(Prs_Man_t *, int)");
              }
              goto switchD_0035f134_caseD_1;
            }
            if (pbVar3[1] == 0x7c) {
              p->pCur = (char *)(pbVar3 + 2);
              uVar12 = 0x24;
            }
            else {
              p->pCur = (char *)(pbVar3 + 1);
              uVar12 = 0xc;
            }
          }
          goto LAB_0035f411;
        }
        uVar9 = (&switchD_0035f134::switchdataD_007dbc90)[uVar10] + 0x7dbc90;
        switch(uVar10) {
        case 0:
          if (pbVar3[1] != 0x3d) goto switchD_0035f134_caseD_1;
          p->pCur = (char *)(pbVar3 + 2);
          uVar12 = 0x40;
          break;
        default:
switchD_0035f134_caseD_1:
          pcVar8 = "Unsupported operation.";
LAB_0035f10a:
          Prs_ManErrorSet(p,pcVar8,uVar9);
          return 0;
        case 4:
          p->pCur = (char *)(pbVar3 + 1);
          uVar12 = 0x34;
          break;
        case 5:
          if (pbVar3[1] == 0x26) {
            p->pCur = (char *)(pbVar3 + 2);
            uVar12 = 0x22;
          }
          else {
            p->pCur = (char *)(pbVar3 + 1);
            uVar12 = 10;
          }
          break;
        case 9:
          if (pbVar3[1] == 0x2a) {
            p->pCur = (char *)(pbVar3 + 2);
            uVar12 = 0x36;
          }
          else {
            p->pCur = (char *)(pbVar3 + 1);
            uVar12 = 0x31;
          }
          break;
        case 10:
          uVar12 = 0x2f;
          p->pCur = (char *)(pbVar3 + 1);
          break;
        case 0xb:
        case 0x1a:
          goto switchD_0035f134_caseD_b;
        case 0xc:
          p->pCur = (char *)(pbVar3 + 1);
          uVar12 = 0x30;
          break;
        case 0xe:
          p->pCur = (char *)(pbVar3 + 1);
          uVar12 = 0x33;
          break;
        case 0x1b:
          if (pbVar3[1] == 0x3d) {
            if (pbVar3[1] != 0x3d) goto switchD_0035f134_caseD_1;
            p->pCur = (char *)(pbVar3 + 2);
            uVar12 = 0x3c;
          }
          else if (pbVar3[1] == 0x3c) {
            if (pbVar3[2] == 0x3c) {
              if (pbVar3[2] != 0x3c) goto LAB_0035f3cc;
              p->pCur = (char *)(pbVar3 + 3);
              uVar12 = 0x43;
            }
            else {
              p->pCur = (char *)(pbVar3 + 2);
              uVar12 = (uint)(bVar14 ^ 1) * 4 + 0x41;
            }
          }
          else {
LAB_0035f3cc:
            p->pCur = (char *)(pbVar3 + 1);
            uVar12 = 0x3b;
          }
          break;
        case 0x1c:
          if (pbVar3[1] != 0x3d) goto switchD_0035f134_caseD_1;
          p->pCur = (char *)(pbVar3 + 2);
          uVar12 = 0x3f;
          break;
        case 0x1d:
          if (pbVar3[1] == 0x3d) {
            if (pbVar3[1] != 0x3d) goto switchD_0035f134_caseD_1;
            p->pCur = (char *)(pbVar3 + 2);
            uVar12 = 0x3d;
          }
          else if (pbVar3[1] == 0x3e) {
            if (pbVar3[2] == 0x3e) {
              if (pbVar3[2] != 0x3e) goto LAB_0035f3d7;
              p->pCur = (char *)(pbVar3 + 3);
              uVar12 = 0x44;
            }
            else {
              p->pCur = (char *)(pbVar3 + 2);
              uVar12 = (uint)(bVar14 ^ 1) * 4 + 0x42;
            }
          }
          else {
LAB_0035f3d7:
            p->pCur = (char *)(pbVar3 + 1);
            uVar12 = 0x3e;
          }
          break;
        case 0x1e:
          p->pCur = (char *)(pbVar3 + 1);
          iVar5 = Prs_ManReadSignal(p);
          if (iVar5 == 0) {
            return 0;
          }
          Vec_IntPush(p_00,0);
          Vec_IntPush(p_00,iVar5);
          iVar5 = Prs_ManUtilSkipSpaces(p);
          uVar9 = extraout_EDX_11;
          if (iVar5 == 0) {
            if (*p->pCur != ':') {
              pcVar8 = "MUX lacks the colon symbol (:).";
              goto LAB_0035f10a;
            }
            p->pCur = p->pCur + 1;
            iVar5 = Prs_ManReadSignal(p);
            if (iVar5 == 0) {
              return 0;
            }
            Vec_IntPush(p_00,0);
            Vec_IntPush(p_00,iVar5);
            iVar5 = Prs_ManUtilSkipSpaces(p);
            uVar9 = extraout_EDX_12;
            if (iVar5 == 0) {
              if ((p->vTemp).nSize != 8) {
                __assert_fail("Vec_IntSize(&p->vTemp) == 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                              ,0x3e2,"int Prs_ManReadExpression(Prs_Man_t *, int)");
              }
              uVar12 = 0x12;
              goto switchD_0035f134_caseD_b;
            }
          }
          goto LAB_0035f103;
        }
LAB_0035f411:
        iVar5 = Prs_ManReadSignal(p);
        if (iVar5 == 0) {
          return 0;
        }
        Vec_IntPush(p_00,0);
        Vec_IntPush(p_00,iVar5);
        if (uVar12 == 0x2f) {
          Vec_IntInsert(p_00,2,0);
          Vec_IntInsert(p_00,3,0);
          uVar12 = 0x2f;
        }
      }
switchD_0035f134_caseD_b:
      iVar4 = Prs_ManUtilSkipSpaces(p);
      iVar5 = extraout_EDX_02;
      if (iVar4 == 0) {
        if (bVar14 == false) {
          Prs_ManUtilSkipUntilWord(p,";");
          p->pCur = p->pCur + -1;
LAB_0035ef31:
          Prs_NtkAddBox(p->pNtk,uVar12,0,p_00);
          return 1;
        }
        if ((*p->pCur == ',') || (*p->pCur == ';')) goto LAB_0035ef31;
        pcVar8 = "Trailing symbols on this line.";
        goto LAB_0035ee58;
      }
    }
  }
LAB_0035ee51:
  pcVar8 = "Error number 24.";
LAB_0035ee58:
  Prs_ManErrorSet(p,pcVar8,iVar5);
  return 0;
}

Assistant:

static inline int Prs_ManReadExpression( Prs_Man_t * p, int OutItem )
{
    char * pClose;
    int Item, Type = CBA_OBJ_NONE;
    int fRotating = 0;

    // write output name
    Vec_IntClear( &p->vTemp );
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, OutItem );
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    if ( Prs_ManIsChar(p, '(') )
    {
        // THIS IS A HACK TO DETECT rotating shifters:  try to find both << and >> on the same line
        if ( Prs_ManUtilDetectTwo(p, '>', '>') && Prs_ManUtilDetectTwo(p, '<', '<') )
            fRotating = 1;
        pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
        if ( pClose == NULL )
            return Prs_ManErrorSet(p, "Expecting closing parenthesis 1.", 0); 
        *p->pCur = *pClose = ' ';
    }
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
    // read constant or concatenation
    if ( Prs_ManIsDigit(p) || Prs_ManIsChar(p, '{') )
    {
        Item = Prs_ManReadSignal( p );
        // write constant
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        Type = CBA_BOX_BUF;
    }
    else if ( Prs_ManIsChar(p, '!') || Prs_ManIsChar(p, '~') || Prs_ManIsChar(p, '@') ||
              Prs_ManIsChar(p, '&') || Prs_ManIsChar(p, '|') || Prs_ManIsChar(p, '^') || Prs_ManIsChar(p, '-') )
    {
        if ( Prs_ManIsChar(p, '!') )
            Type = CBA_BOX_LNOT;
        else if ( Prs_ManIsChar(p, '~') )
            Type = CBA_BOX_INV;
        else if ( Prs_ManIsChar(p, '@') )
            Type = CBA_BOX_SQRT;
        else if ( Prs_ManIsChar(p, '&') )
            Type = CBA_BOX_RAND;
        else if ( Prs_ManIsChar(p, '|') )
            Type = CBA_BOX_ROR;
        else if ( Prs_ManIsChar(p, '^') )
            Type = CBA_BOX_RXOR;
        else if ( Prs_ManIsChar(p, '-') )
            Type = CBA_BOX_MIN;
        else assert( 0 );
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // skip parentheses
        if ( Prs_ManIsChar(p, '(') )
        {
            pClose = Prs_ManFindClosingParenthesis( p, '(', ')' );
            if ( pClose == NULL )
                return Prs_ManErrorSet(p, "Expecting closing parenthesis 2.", 0); 
            *p->pCur = *pClose = ' ';
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a unary operator.", 0);
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
    }
    else
    {
        // read first name
        Item = Prs_ManReadSignal( p );
        if ( Item == 0 )                        return Prs_ManErrorSet(p, "Cannot read name after a binary operator.", 0);
        // check if this is a recent function
        if ( Abc_Lit2Var2(Item) == p->FuncNameId )
        {
            int Status, nInputs, RangeSize;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, '(') )       return Prs_ManErrorSet(p, "Error number 24.", 0);
            p->pCur++;
            Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
            nInputs = Vec_IntSize(&p->vTemp)/2;
            RangeSize = p->FuncRangeId ? Ptr_NtkRangeSize(p->pNtk, p->FuncRangeId) : 1;
            p->FuncNameId = p->FuncRangeId = 0;
            if ( Status == 0 )                  return 0;
            if ( nInputs == 1 )
                Type = CBA_BOX_DEC;
            else if ( nInputs == RangeSize + 1 )
                Type = CBA_BOX_SEL;
            else if ( nInputs == (1 << RangeSize) + 1 )
                Type = CBA_BOX_NMUX;
            else                                return Prs_ManErrorSet(p, "Cannot determine word-level operator.", 0);
            p->pCur++;
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            // save word-level operator
            Vec_IntInsert( &p->vTemp, 0, 0 );
            Vec_IntInsert( &p->vTemp, 1, OutItem );
            Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
            return 1;
        }
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, Item );
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 24.", 0);
        assert( !Prs_ManIsChar(p, '[') );

        // get the next symbol
        if ( Prs_ManIsChar(p, ',') || Prs_ManIsChar(p, ';') )
            Type = CBA_BOX_BUF;
        else if ( Prs_ManIsChar(p, '?') )
        {
            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            if ( !Prs_ManIsChar(p, ':') )       return Prs_ManErrorSet(p, "MUX lacks the colon symbol (:).", 0);

            p->pCur++;
            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 24.", 0);
            assert( Vec_IntSize(&p->vTemp) == 8 );
            //ABC_SWAP( int, Vec_IntArray(&p->vTemp)[3], Vec_IntArray(&p->vTemp)[5] );
            Type = CBA_BOX_MUX;
        }
        else 
        {
                 if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] != '>' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTR : CBA_BOX_SHIR;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '>' && p->pCur[2] == '>' )  p->pCur += 3, Type = CBA_BOX_SHIRA;      
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] != '<' )  p->pCur += 2, Type = fRotating ? CBA_BOX_ROTL : CBA_BOX_SHIL;
            else if ( p->pCur[0] == '<' && p->pCur[1] == '<' && p->pCur[2] == '<' )  p->pCur += 3, Type = CBA_BOX_SHILA;      
            else if ( p->pCur[0] == '&' && p->pCur[1] != '&'                      )  p->pCur += 1, Type = CBA_BOX_AND;       
            else if ( p->pCur[0] == '|' && p->pCur[1] != '|'                      )  p->pCur += 1, Type = CBA_BOX_OR;        
            else if ( p->pCur[0] == '^' && p->pCur[1] != '^'                      )  p->pCur += 1, Type = CBA_BOX_XOR;       
            else if ( p->pCur[0] == '&' && p->pCur[1] == '&'                      )  p->pCur += 2, Type = CBA_BOX_LAND;     
            else if ( p->pCur[0] == '|' && p->pCur[1] == '|'                      )  p->pCur += 2, Type = CBA_BOX_LOR;      
            else if ( p->pCur[0] == '=' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_EQU;      
            else if ( p->pCur[0] == '!' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_NEQU;      
            else if ( p->pCur[0] == '<' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_LTHAN;     
            else if ( p->pCur[0] == '>' && p->pCur[1] != '='                      )  p->pCur += 1, Type = CBA_BOX_MTHAN;     
            else if ( p->pCur[0] == '<' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_LETHAN;
            else if ( p->pCur[0] == '>' && p->pCur[1] == '='                      )  p->pCur += 2, Type = CBA_BOX_METHAN;  
            else if ( p->pCur[0] == '+'                                           )  p->pCur += 1, Type = CBA_BOX_ADD;       
            else if ( p->pCur[0] == '-'                                           )  p->pCur += 1, Type = CBA_BOX_SUB;       
            else if ( p->pCur[0] == '*' && p->pCur[1] != '*'                      )  p->pCur += 1, Type = CBA_BOX_MUL;     
            else if ( p->pCur[0] == '/'                                           )  p->pCur += 1, Type = CBA_BOX_DIV;        
            else if ( p->pCur[0] == '%'                                           )  p->pCur += 1, Type = CBA_BOX_MOD;   
            else if ( p->pCur[0] == '*' && p->pCur[1] == '*'                      )  p->pCur += 2, Type = CBA_BOX_POW;
            else return Prs_ManErrorSet(p, "Unsupported operation.", 0);

            Item = Prs_ManReadSignal( p );
            if ( Item == 0 )                    return 0;
            Vec_IntPush( &p->vTemp, 0 );
            Vec_IntPush( &p->vTemp, Item );
            // for adder insert carry-in
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 2, 0 );
            if ( Type == CBA_BOX_ADD )
                Vec_IntInsert( &p->vTemp, 3, 0 );
        }
    }
    if ( Prs_ManUtilSkipSpaces(p) )                              return Prs_ManErrorSet(p, "Error number 24.", 0);
    // make sure there is nothing left there
    if ( fRotating )
    {
        Prs_ManUtilSkipUntilWord(p, ";");
        p->pCur--;
    }
    else if ( !Prs_ManIsChar(p, ',') && !Prs_ManIsChar(p, ';') ) return Prs_ManErrorSet(p, "Trailing symbols on this line.", 0);
    // save binary operator
    Prs_NtkAddBox( p->pNtk, Type, 0, &p->vTemp );
    return 1;
}